

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O3

int cmListFileLexer_SetFileName(cmListFileLexer *lexer,char *name,cmListFileLexer_BOM *bom)

{
  int iVar1;
  yyguts_t_conflict *yyg;
  FILE *__stream;
  size_t sVar2;
  cmListFileLexer_BOM cVar3;
  int iVar4;
  uchar b [2];
  char local_32;
  char local_31;
  fpos_t local_30;
  
  cmListFileLexerDestroy(lexer);
  iVar4 = 1;
  if (name == (char *)0x0) goto LAB_003957ee;
  __stream = fopen(name,"rb");
  lexer->file = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    iVar4 = 0;
    goto LAB_003957ee;
  }
  if (bom == (cmListFileLexer_BOM *)0x0) goto LAB_003957ee;
  sVar2 = fread(&local_32,1,2,__stream);
  if (sVar2 == 2) {
    if (local_31 == -0x45 && local_32 == -0x11) {
      sVar2 = fread(&local_32,1,1,__stream);
      if ((sVar2 != 1) || (cVar3 = cmListFileLexer_BOM_UTF8, local_32 != -0x41)) goto LAB_003957d8;
    }
    else {
      cVar3 = cmListFileLexer_BOM_UTF16BE;
      if (local_31 != -1 || local_32 != -2) {
        if (local_32 == '\0' && local_31 == '\0') {
          sVar2 = fread(&local_32,1,2,__stream);
          if (((sVar2 != 2) || (local_32 != -2)) ||
             (cVar3 = cmListFileLexer_BOM_UTF32BE, local_31 != -1)) goto LAB_003957d8;
        }
        else {
          if (local_31 != -2 || local_32 != -1) goto LAB_003957d8;
          fgetpos(__stream,&local_30);
          sVar2 = fread(&local_32,1,2,__stream);
          if (((sVar2 != 2) || (local_32 != '\0')) ||
             (cVar3 = cmListFileLexer_BOM_UTF32LE, local_31 != '\0')) {
            iVar1 = fsetpos(__stream,&local_30);
            cVar3 = (uint)(iVar1 == 0) * 3 + cmListFileLexer_BOM_Broken;
          }
        }
      }
    }
  }
  else {
LAB_003957d8:
    iVar1 = fseek(__stream,0,0);
    cVar3 = (cmListFileLexer_BOM)(iVar1 != 0);
  }
  *bom = cVar3;
LAB_003957ee:
  if ((lexer->file != (FILE *)0x0) || (lexer->string_buffer != (char *)0x0)) {
    cmListFileLexer_yylex_init(&lexer->scanner);
    *(cmListFileLexer **)lexer->scanner = lexer;
  }
  return iVar4;
}

Assistant:

int cmListFileLexer_SetFileName(cmListFileLexer* lexer, const char* name,
                                cmListFileLexer_BOM* bom)
{
  int result = 1;
  cmListFileLexerDestroy(lexer);
  if (name) {
#ifdef _WIN32
    wchar_t* wname = cmsysEncoding_DupToWide(name);
    lexer->file = _wfopen(wname, L"rb");
    free(wname);
#else
    lexer->file = fopen(name, "rb");
#endif
    if (lexer->file) {
      if (bom) {
        *bom = cmListFileLexer_ReadBOM(lexer->file);
      }
    } else {
      result = 0;
    }
  }
  cmListFileLexerInit(lexer);
  return result;
}